

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::log_<unsigned_long&,unsigned_long,unsigned_long>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,unsigned_long *args,
          unsigned_long *args_1,unsigned_long *args_2)

{
  format_args args_00;
  string_view fmt_00;
  char *pcVar1;
  size_t count;
  undefined8 in_RCX;
  undefined8 in_RDX;
  size_t in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  undefined8 *in_stack_00000020;
  exception *ex;
  log_msg log_msg;
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  int ignore;
  string_view sv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa98;
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffaa0;
  undefined8 uVar2;
  logger *in_stack_fffffffffffffaa8;
  log_msg *log_msg_00;
  logger *in_stack_fffffffffffffab0;
  basic_appender<char> *in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffffae8;
  level_enum in_stack_fffffffffffffb0c;
  log_msg *in_stack_fffffffffffffb10;
  string_view_t in_stack_fffffffffffffb18;
  string_view_t in_stack_fffffffffffffb28;
  source_loc in_stack_fffffffffffffb40;
  basic_string_view<char> local_468 [2];
  undefined8 local_448;
  undefined8 uStack_440;
  log_msg *local_438;
  buffer<char> *local_3d0;
  undefined8 local_3c8 [2];
  undefined8 local_3b8 [2];
  undefined8 local_3a8 [2];
  undefined8 local_398;
  undefined8 *local_390;
  undefined8 local_388;
  undefined8 local_380;
  basic_appender<char> local_378 [4];
  buffer<char> local_358 [9];
  undefined1 local_232;
  byte local_231;
  undefined8 *local_230;
  undefined8 *local_228;
  undefined8 local_210;
  undefined8 local_208;
  undefined8 *local_200;
  undefined8 *local_1f8;
  undefined8 *local_1f0;
  undefined8 *local_1e8;
  undefined8 *local_1e0;
  undefined8 local_158;
  undefined8 *local_150;
  undefined8 local_148;
  undefined8 *local_140;
  undefined8 local_138;
  undefined8 *local_130;
  undefined8 local_30;
  undefined8 *local_28;
  undefined8 local_20;
  undefined8 *local_18;
  undefined8 local_10;
  undefined8 *local_8;
  
  pcVar1 = &stack0x00000008;
  local_230 = in_R9;
  local_228 = in_R8;
  local_210 = in_RDX;
  local_208 = in_RCX;
  local_231 = should_log(in_stack_fffffffffffffaa8,
                         (level_enum)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
  local_232 = details::backtracer::enabled((backtracer *)0x21132b);
  if (((local_231 & 1) != 0) || ((bool)local_232)) {
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    basic_memory_buffer(in_stack_fffffffffffffaa0,(allocator<char> *)in_stack_fffffffffffffa98);
    ::fmt::v11::basic_appender<char>::basic_appender(local_378,local_358);
    local_388 = local_210;
    local_380 = local_208;
    local_1f0 = local_228;
    local_1f8 = local_230;
    local_200 = in_stack_00000020;
    local_138 = *local_228;
    local_130 = local_3c8;
    local_140 = local_3b8;
    local_148 = *local_230;
    local_150 = local_3a8;
    local_158 = *in_stack_00000020;
    local_1e0 = &local_398;
    local_1e8 = local_3c8;
    local_398 = 0x444;
    fmt_00.size_ = in_RDI;
    fmt_00.data_ = pcVar1;
    args_00.desc_._4_4_ = in_stack_fffffffffffffae4;
    args_00.desc_._0_4_ = in_stack_fffffffffffffae0;
    args_00.field_1.args_ = in_stack_fffffffffffffae8.args_;
    local_30 = local_138;
    local_28 = local_130;
    local_20 = local_148;
    local_18 = local_140;
    local_10 = local_158;
    local_8 = local_150;
    local_3c8[0] = local_138;
    local_3b8[0] = local_148;
    local_3a8[0] = local_158;
    local_390 = local_1e8;
    local_3d0 = (buffer<char> *)
                ::fmt::v11::vformat_to<fmt::v11::basic_appender<char>,_0>
                          (in_stack_fffffffffffffad8,fmt_00,args_00);
    local_438 = *(log_msg **)(pcVar1 + 0x10);
    local_448 = *(undefined8 *)pcVar1;
    uStack_440 = *(undefined8 *)(pcVar1 + 8);
    ::fmt::v11::basic_string_view<char>::
    basic_string_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string_view<char> *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
    pcVar1 = ::fmt::v11::detail::buffer<char>::data(local_358);
    count = ::fmt::v11::detail::buffer<char>::size(local_358);
    ::fmt::v11::basic_string_view<char>::basic_string_view(local_468,pcVar1,count);
    uVar2 = uStack_440;
    log_msg_00 = local_438;
    details::log_msg::log_msg
              (in_stack_fffffffffffffb10,in_stack_fffffffffffffb40,in_stack_fffffffffffffb28,
               in_stack_fffffffffffffb0c,in_stack_fffffffffffffb18);
    log_it_(in_stack_fffffffffffffab0,log_msg_00,SUB81((ulong)uVar2 >> 0x38,0),
            SUB81((ulong)uVar2 >> 0x30,0));
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    ~basic_memory_buffer
              ((basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *)0x21164a);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&...args) {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled) {
            return;
        }
        SPDLOG_TRY {
            memory_buf_t buf;
#ifdef SPDLOG_USE_STD_FORMAT
            fmt_lib::vformat_to(std::back_inserter(buf), fmt, fmt_lib::make_format_args(args...));
#else
            fmt::vformat_to(fmt::appender(buf), fmt, fmt::make_format_args(args...));
#endif

            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }